

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O3

void Eso_ManMinimizeAdd(Eso_Man_t *p,int Cube)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Hsh_VecMan_t *pHVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  uint uVar8;
  ulong uVar9;
  int *piVar10;
  uint uVar11;
  long lVar12;
  uint *puVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint *pCube2;
  ulong uVar18;
  int nLits;
  
  uVar9 = (ulong)(uint)Cube;
LAB_006d8d24:
  uVar8 = p->Cube1;
  uVar11 = (uint)uVar9;
  if (uVar8 == uVar11) {
    uVar9 = 0;
    pCube2 = (uint *)0x0;
  }
  else {
    if ((int)uVar11 < 0) {
      __assert_fail("iCube >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEsop.c"
                    ,0x30,"Vec_Int_t *Eso_ManCube(Eso_Man_t *, int)");
    }
    pHVar4 = p->pHash;
    if (pHVar4->vMap->nSize <= (int)uVar11) {
LAB_006d926d:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar1 = pHVar4->vMap->pArray[uVar9];
    if (((long)iVar1 < 0) || (pHVar4->vData->nSize <= iVar1)) {
LAB_006d924e:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    puVar13 = (uint *)(pHVar4->vData->pArray + iVar1);
    pCube2 = puVar13 + 2;
    uVar15 = *puVar13;
    uVar9 = (ulong)uVar15;
    (pHVar4->vTemp).nCap = uVar15;
    (pHVar4->vTemp).nSize = uVar15;
    (pHVar4->vTemp).pArray = (int *)pCube2;
    if ((int)uVar15 < 0) goto LAB_006d928c;
  }
  iVar1 = p->vCubes->nSize;
  nLits = (int)uVar9;
  if (iVar1 <= nLits) {
LAB_006d928c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar5 = p->vCubes->pArray;
  p_00 = pVVar5 + uVar9;
  iVar2 = pVVar5[uVar9].nSize;
  if (0 < (long)iVar2) {
    piVar6 = p_00->pArray;
    lVar12 = 0;
    do {
      if (piVar6[lVar12] == uVar11) {
        if ((int)(uint)lVar12 < iVar2) {
          p_00->nSize = iVar2 - 1U;
          if ((uint)lVar12 < iVar2 - 1U) {
            do {
              piVar6[lVar12] = piVar6[lVar12 + 1];
              lVar12 = lVar12 + 1;
            } while ((int)lVar12 < p_00->nSize);
          }
          return;
        }
        goto LAB_006d92ca;
      }
      lVar12 = lVar12 + 1;
    } while (iVar2 != lVar12);
  }
  if (uVar8 == uVar11) {
    if (iVar2 != 0) {
      __assert_fail("Vec_IntSize(vLevel) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEsop.c"
                    ,0x10b,"void Eso_ManMinimizeAdd(Eso_Man_t *, int)");
    }
  }
  else {
    if (nLits < p->nVars + -1) {
      uVar18 = (ulong)(nLits + 1U);
      if (iVar1 <= (int)(nLits + 1U)) goto LAB_006d928c;
      iVar1 = pVVar5[uVar18].nSize;
      if (0 < (long)iVar1) {
        piVar6 = pVVar5[uVar18].pArray;
        lVar12 = 0;
LAB_006d8e1e:
        uVar8 = piVar6[lVar12];
        if ((ulong)uVar8 == 0xffffffff) {
          piVar10 = (int *)0x0;
        }
        else {
          if ((int)uVar8 < 0) goto LAB_006d926d;
          pVVar7 = p->pHash->vMap;
          if (pVVar7->nSize <= (int)uVar8) goto LAB_006d926d;
          iVar3 = pVVar7->pArray[uVar8];
          if (((long)iVar3 < 0) || (pVVar7 = p->pHash->vData, pVVar7->nSize <= iVar3))
          goto LAB_006d924e;
          piVar10 = pVVar7->pArray + iVar3;
        }
        if (nLits != 0) {
          puVar13 = (uint *)(piVar10 + 2);
          uVar15 = 0;
          uVar8 = 0xffffffff;
          do {
            if (pCube2[(int)uVar15] != *puVar13) {
              if (uVar8 != 0xffffffff) goto LAB_006d8eb8;
              uVar8 = uVar15;
              uVar15 = uVar15 - 1;
            }
            uVar15 = uVar15 + 1;
            puVar13 = puVar13 + 1;
            if (nLits <= (int)uVar15) {
              if (uVar8 != 0xffffffff) {
                uVar9 = (ulong)uVar8;
              }
              uVar8 = (uint)lVar12;
              uVar17 = uVar18;
              goto LAB_006d913e;
            }
          } while( true );
        }
        uVar8 = 0;
        uVar17 = 1;
        lVar12 = 0;
        uVar9 = 0;
LAB_006d913e:
        pVVar5[uVar18].nSize = iVar1 - 1U;
        if (uVar8 < iVar1 - 1U) {
          do {
            piVar6[lVar12] = piVar6[lVar12 + 1];
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 < pVVar5[uVar18].nSize);
        }
        p->vCube->nSize = 0;
        uVar18 = 0;
        do {
          if (piVar10[uVar18 + 2] < 0) goto LAB_006d922f;
          Vec_IntPush(p->vCube,piVar10[uVar18 + 2] ^ (uint)(uVar9 == uVar18));
          uVar18 = uVar18 + 1;
        } while (uVar17 != uVar18);
        uVar8 = Hsh_VecManAdd(p->pHash,p->vCube);
        uVar9 = (ulong)uVar8;
        goto LAB_006d8d24;
      }
    }
LAB_006d8ecc:
    if (0 < iVar2) {
      lVar12 = 0;
      while( true ) {
        iVar1 = p_00->pArray[lVar12];
        if ((long)iVar1 < 0) goto LAB_006d926d;
        pVVar5 = p->pHash->vMap;
        if (pVVar5->nSize <= iVar1) goto LAB_006d926d;
        iVar1 = pVVar5->pArray[iVar1];
        if (((long)iVar1 < 0) || (pVVar5 = p->pHash->vData, pVVar5->nSize <= iVar1))
        goto LAB_006d924e;
        uVar8 = Eso_ManFindDistOneLitEqual(pVVar5->pArray + (long)iVar1 + 2,(int *)pCube2,nLits);
        iVar1 = p_00->nSize;
        if (uVar8 != 0xffffffff) break;
        lVar12 = lVar12 + 1;
        if (iVar1 <= lVar12) goto LAB_006d8f41;
      }
      if (iVar1 <= (int)(uint)lVar12) {
LAB_006d92ca:
        __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x3ff,"void Vec_IntDrop(Vec_Int_t *, int)");
      }
      p_00->nSize = iVar1 - 1U;
      if ((uint)lVar12 < iVar1 - 1U) {
        piVar6 = p_00->pArray;
        do {
          piVar6[lVar12] = piVar6[lVar12 + 1];
          lVar12 = lVar12 + 1;
        } while ((int)lVar12 < p_00->nSize);
      }
      p->vCube->nSize = 0;
      if (nLits == 0) {
LAB_006d911d:
        uVar9 = (ulong)(uint)p->Cube1;
      }
      else {
        uVar18 = 0;
        do {
          if (uVar8 != uVar18) {
            Vec_IntPush(p->vCube,pCube2[uVar18]);
          }
          uVar18 = uVar18 + 1;
        } while (uVar9 != uVar18);
        if (p->vCube->nSize == 0) goto LAB_006d911d;
        uVar8 = Hsh_VecManAdd(p->pHash,p->vCube);
        uVar9 = (ulong)uVar8;
      }
      goto LAB_006d8d24;
    }
LAB_006d8f41:
    if (nLits == 0) {
      __assert_fail("nLits > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEsop.c"
                    ,0x13e,"void Eso_ManMinimizeAdd(Eso_Man_t *, int)");
    }
    if (p->vCubes->nSize < nLits) goto LAB_006d928c;
    uVar15 = nLits - 1;
    pVVar7 = p->vCubes->pArray;
    pVVar5 = pVVar7 + uVar15;
    uVar8 = pVVar7[uVar15].nSize;
    if ((nLits == 1) && (uVar8 == 1)) {
      Vec_IntDrop(pVVar5,0);
      if ((int)uVar11 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf4,"int Abc_LitNot(int)");
      }
      uVar11 = uVar11 ^ 1;
      goto LAB_006d921c;
    }
    if (0 < (int)uVar8) {
      piVar6 = pVVar5->pArray;
      uVar18 = 0;
LAB_006d8f8c:
      uVar14 = piVar6[uVar18];
      if ((ulong)uVar14 == 0xffffffff) {
        piVar10 = (int *)0x0;
      }
      else {
        if ((int)uVar14 < 0) goto LAB_006d926d;
        pVVar7 = p->pHash->vMap;
        if (pVVar7->nSize <= (int)uVar14) goto LAB_006d926d;
        iVar1 = pVVar7->pArray[uVar14];
        if (((long)iVar1 < 0) || (pVVar7 = p->pHash->vData, pVVar7->nSize <= iVar1))
        goto LAB_006d924e;
        piVar10 = pVVar7->pArray + iVar1;
      }
      if (nLits != 1) {
        uVar16 = 0;
        uVar14 = 0xffffffff;
        puVar13 = pCube2;
        do {
          if (piVar10[(long)(int)uVar16 + 2] != *puVar13) {
            if (uVar14 != 0xffffffff) goto LAB_006d901f;
            uVar14 = uVar16;
            uVar16 = uVar16 - 1;
          }
          uVar16 = uVar16 + 1;
          puVar13 = puVar13 + 1;
          if ((int)uVar15 <= (int)uVar16) {
            if (uVar14 != 0xffffffff) {
              uVar15 = uVar14;
            }
            uVar11 = (uint)uVar18;
            goto LAB_006d903a;
          }
        } while( true );
      }
      uVar11 = 0;
      uVar18 = 0;
      uVar15 = 0;
LAB_006d903a:
      pVVar5->nSize = uVar8 - 1;
      if (uVar11 < uVar8 - 1) {
        do {
          piVar6[uVar18] = piVar6[uVar18 + 1];
          uVar18 = uVar18 + 1;
        } while ((int)uVar18 < pVVar5->nSize);
      }
      p->vCube->nSize = 0;
      uVar18 = 0;
      do {
        if ((int)pCube2[uVar18] < 0) {
LAB_006d922f:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf5,"int Abc_LitNotCond(int, int)");
        }
        Vec_IntPush(p->vCube,pCube2[uVar18] ^ (uint)(uVar15 == uVar18));
        uVar18 = uVar18 + 1;
      } while (uVar9 != uVar18);
      uVar8 = Hsh_VecManAdd(p->pHash,p->vCube);
      uVar9 = (ulong)uVar8;
      goto LAB_006d8d24;
    }
  }
LAB_006d921c:
  Vec_IntPush(p_00,uVar11);
  return;
LAB_006d8eb8:
  lVar12 = lVar12 + 1;
  if (lVar12 == iVar1) goto LAB_006d8ecc;
  goto LAB_006d8e1e;
LAB_006d901f:
  uVar18 = uVar18 + 1;
  if (uVar18 == uVar8) goto LAB_006d921c;
  goto LAB_006d8f8c;
}

Assistant:

void Eso_ManMinimizeAdd( Eso_Man_t * p, int Cube )
{
    int fMimimize = 1;
    Vec_Int_t * vCube      = (Cube == p->Cube1) ? NULL : Eso_ManCube(p, Cube); 
    int * pCube2, * pCube  = (Cube == p->Cube1) ? NULL : Vec_IntArray(vCube); 
    int Cube2, nLits       = (Cube == p->Cube1) ? 0 : Vec_IntSize(vCube);
    Vec_Int_t * vLevel     = Vec_WecEntry( p->vCubes, nLits );
    int c, k, iLit, iPlace = Vec_IntFind( vLevel, Cube );
    if ( iPlace >= 0 ) // identical found
    {
        Vec_IntDrop( vLevel, iPlace );
        return;
    }
    if ( Cube == p->Cube1 ) // simple case
    {
        assert( Vec_IntSize(vLevel) == 0 );
        Vec_IntPush( vLevel, Cube );
        return;
    }
    // look for distance-1 in next bin
    if ( fMimimize && nLits < p->nVars - 1 )
    {
        Vec_Int_t * vLevel = Vec_WecEntry( p->vCubes, nLits+1 );
        Vec_IntForEachEntry( vLevel, Cube2, c )
        {
            pCube2 = Hsh_VecReadArray( p->pHash, Cube2 ); 
            iLit = Eso_ManFindDistOneLitNotEqual( pCube, pCube2, nLits );
            if ( iLit == -1 )
                continue;
            // remove this cube
            Vec_IntDrop( vLevel, c );
            // create new cube
            Vec_IntClear( p->vCube );
            for ( k = 0; k <= nLits; k++ )
                Vec_IntPush( p->vCube, Abc_LitNotCond(pCube2[k], k == iLit) );
            Cube = Hsh_VecManAdd( p->pHash, p->vCube );
            // try to add new cube
            Eso_ManMinimizeAdd( p, Cube );
            return;
        }
    }
    // look for distance-1 in the same bin
    if ( fMimimize )
    {
        Vec_IntForEachEntry( vLevel, Cube2, c )
        {
            pCube2 = Hsh_VecReadArray( p->pHash, Cube2 ); 
            iLit = Eso_ManFindDistOneLitEqual( pCube2, pCube, nLits );
            if ( iLit == -1 )
                continue;
            // remove this cube
            Vec_IntDrop( vLevel, c );
            // create new cube
            Vec_IntClear( p->vCube );
            for ( k = 0; k < nLits; k++ )
                if ( k != iLit )
                    Vec_IntPush( p->vCube, pCube[k] );
            if ( Vec_IntSize(p->vCube) == 0 )
                Cube = p->Cube1;
            else
                Cube = Hsh_VecManAdd( p->pHash, p->vCube );
            // try to add new cube
            Eso_ManMinimizeAdd( p, Cube );
            return;
        }
    }
    assert( nLits > 0 );
    if ( fMimimize && nLits > 0 )
    {
        // look for distance-1 in the previous bin
        Vec_Int_t * vLevel = Vec_WecEntry( p->vCubes, nLits-1 );
        // check for the case of one-literal cube
        if ( nLits == 1 && Vec_IntSize(vLevel) == 1 )
        {
            Vec_IntDrop( vLevel, 0 );
            Cube = Abc_LitNot( Cube );
        }
        else
        Vec_IntForEachEntry( vLevel, Cube2, c )
        {
            pCube2 = Hsh_VecReadArray( p->pHash, Cube2 ); 
            iLit = Eso_ManFindDistOneLitNotEqual( pCube2, pCube, nLits-1 );
            if ( iLit == -1 )
                continue;
            // remove this cube
            Vec_IntDrop( vLevel, c );
            // create new cube
            Vec_IntClear( p->vCube );
            for ( k = 0; k < nLits; k++ )
                Vec_IntPush( p->vCube, Abc_LitNotCond(pCube[k], k == iLit) );
            Cube = Hsh_VecManAdd( p->pHash, p->vCube );
            // try to add new cube
            Eso_ManMinimizeAdd( p, Cube );
            return;
        }
    }
    // could not find - simply add this cube
    Vec_IntPush( vLevel, Cube );
}